

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  byte type2;
  ushort uVar2;
  ushort x;
  int iVar3;
  uint16_t *puVar4;
  container_t *c2;
  uint pos;
  int *c;
  uint uVar5;
  int iVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint8_t uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  uint8_t result_type;
  uint8_t local_61 [9];
  int *local_58;
  ushort local_4e;
  uint local_4c;
  ulong local_48;
  int local_3c;
  roaring_bitmap_t *local_38;
  
  if (x1 != x2) {
    iVar3 = (x1->high_low_container).size;
    iVar16 = (x2->high_low_container).size;
    local_48 = 0;
    pos = 0;
    if (0 < iVar16 && 0 < iVar3) {
      pos = 0;
      uVar12 = 0;
      local_48 = 0;
      local_3c = iVar16;
      local_38 = x2;
      do {
        uVar5 = pos & 0xffff;
        uVar2 = (x1->high_low_container).keys[uVar5];
        puVar4 = (x2->high_low_container).keys;
        uVar8 = uVar12 & 0xffff;
        x = puVar4[uVar8];
        if (uVar2 == x) {
          bVar1 = (x1->high_low_container).typecodes[uVar5];
          local_58 = (int *)(x1->high_low_container).containers[uVar5];
          type2 = (x2->high_low_container).typecodes[uVar8];
          c2 = (x2->high_low_container).containers[uVar8];
          local_4e = uVar2;
          local_4c = pos;
          if (bVar1 != 4) {
            if (type2 == 4) {
              type2 = *(byte *)((long)c2 + 8);
            }
            local_61[1] = '\0';
            local_61[2] = '\0';
            local_61[3] = '\0';
            local_61[4] = '\0';
            local_61[5] = '\0';
            local_61[6] = '\0';
            local_61[7] = '\0';
            local_61[8] = '\0';
            (*(code *)(&DAT_00126468 +
                      *(int *)(&DAT_00126468 + (ulong)(((uint)type2 + (uint)bVar1 * 4) - 5) * 4)))()
            ;
            return;
          }
          c = (int *)container_and(local_58,'\x04',c2,type2,local_61);
          if (c != local_58) {
            container_free(local_58,'\x04');
          }
          iVar16 = local_3c;
          piVar7 = c;
          uVar13 = local_61[0];
          if (local_61[0] == '\x04') {
            uVar13 = (uint8_t)c[2];
            piVar7 = *(int **)c;
          }
          iVar10 = *piVar7;
          if ((uVar13 == '\x03') || (uVar13 == '\x02')) {
            bVar17 = 0 < iVar10;
          }
          else {
            if (iVar10 == -1) {
              if (**(long **)(piVar7 + 2) == 0) {
                uVar11 = 0xffffffffffffffff;
                do {
                  if (uVar11 == 0x3fe) {
                    uVar14 = 0x3ff;
                    break;
                  }
                  uVar14 = uVar11 + 1;
                  lVar15 = uVar11 + 2;
                  uVar11 = uVar14;
                } while ((*(long **)(piVar7 + 2))[lVar15] == 0);
                bVar17 = 0x3fe < uVar14;
              }
              else {
                bVar17 = false;
              }
            }
            else {
              bVar17 = iVar10 == 0;
            }
            bVar17 = (bool)(bVar17 ^ 1);
          }
          if (bVar17) {
            iVar10 = (int)local_48;
            (x1->high_low_container).keys[iVar10] = local_4e;
            (x1->high_low_container).containers[iVar10] = c;
            (x1->high_low_container).typecodes[iVar10] = local_61[0];
            local_48 = (ulong)(iVar10 + 1);
          }
          else {
            container_free(c,local_61[0]);
          }
          pos = local_4c + 1;
          x2 = local_38;
          uVar9 = uVar12 + 1;
        }
        else if (uVar2 < x) {
          pos = ra_advance_until_freeing(&x1->high_low_container,x,pos);
          uVar9 = uVar12;
        }
        else {
          uVar8 = (x2->high_low_container).size;
          uVar5 = uVar12 + 1;
          uVar9 = uVar5;
          if (((int)uVar5 < (int)uVar8) && (puVar4[(int)uVar5] < uVar2)) {
            uVar12 = uVar12 + 2;
            iVar10 = 1;
            if ((int)uVar12 < (int)uVar8) {
              iVar6 = 1;
              do {
                iVar10 = iVar6;
                if (uVar2 <= puVar4[(int)uVar12]) goto LAB_00107459;
                iVar10 = iVar6 * 2;
                uVar12 = uVar5 + iVar6 * 2;
                iVar6 = iVar10;
              } while ((int)uVar12 < (int)uVar8);
            }
            uVar12 = uVar8 - 1;
LAB_00107459:
            uVar9 = uVar12;
            if (((puVar4[(int)uVar12] != uVar2) && (uVar9 = uVar8, uVar2 <= puVar4[(int)uVar12])) &&
               (uVar9 = uVar12, (iVar10 >> 1) + uVar5 + 1 != uVar12)) {
              uVar5 = (iVar10 >> 1) + uVar5;
              do {
                uVar9 = (int)(uVar5 + uVar12) >> 1;
                if (puVar4[(int)uVar9] == uVar2) break;
                if (uVar2 <= puVar4[(int)uVar9]) {
                  uVar12 = uVar9;
                  uVar9 = uVar5;
                }
                uVar5 = uVar9;
                uVar9 = uVar12;
              } while (uVar5 + 1 != uVar12);
            }
          }
        }
        uVar12 = uVar9;
      } while (((int)pos < iVar3) && ((int)uVar12 < iVar16));
    }
    iVar16 = iVar3 - pos;
    if (iVar16 != 0 && (int)pos <= iVar3) {
      lVar15 = (long)(int)pos;
      do {
        container_free((x1->high_low_container).containers[lVar15],
                       (x1->high_low_container).typecodes[lVar15]);
        lVar15 = lVar15 + 1;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
    ra_downsize(&x1->high_low_container,(int32_t)local_48);
  }
  return;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}